

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O0

void __thiscall SPSUnit::insertHrdParameters(SPSUnit *this)

{
  int iVar1;
  int iVar2;
  int bitPos;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  size_type __n;
  int vclBitLen_1;
  int nalBitLen_1;
  int vclBitLen;
  int nalBitLen;
  size_t i;
  SPSUnit *this_local;
  
  _vclBitLen = std::vector<HRDParams,_std::allocator<HRDParams>_>::size(&this->mvcNalHrdParams);
  while (__n = _vclBitLen - 1, _vclBitLen != 0) {
    pvVar3 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                       (&this->mvcNalHrdParams,__n);
    _vclBitLen = __n;
    if (((pvVar3->isPresent & 1U) == 0) ||
       (pvVar3 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                           (&this->mvcVclHrdParams,__n), (pvVar3->isPresent & 1U) == 0)) {
      pvVar3 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                         (&this->mvcNalHrdParams,__n);
      iVar1 = pvVar3->bitLen;
      pvVar3 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                         (&this->mvcVclHrdParams,__n);
      iVar2 = pvVar3->bitLen;
      pvVar3 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                         (&this->mvcNalHrdParams,__n);
      if (((pvVar3->isPresent & 1U) == 0) &&
         (pvVar3 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                             (&this->mvcVclHrdParams,__n), (pvVar3->isPresent & 1U) != 0)) {
        pvVar3 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                           (&this->mvcNalHrdParams,__n);
        if (((pvVar3->isPresent & 1U) == 0) ||
           (pvVar3 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                               (&this->mvcVclHrdParams,__n), (pvVar3->isPresent & 1U) != 0)) {
          pvVar3 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                             (&this->mvcVclHrdParams,__n);
          pvVar4 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                             (&this->mvcNalHrdParams,__n);
          HRDParams::operator=(pvVar4,pvVar3);
        }
        else {
          pvVar3 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                             (&this->mvcNalHrdParams,__n);
          HRDParams::resetDefault(pvVar3,true);
          pvVar3 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                             (&this->mvcVclHrdParams,__n);
          HRDParams::resetDefault(pvVar3,true);
        }
      }
      else {
        pvVar3 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                           (&this->mvcNalHrdParams,__n);
        pvVar4 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                           (&this->mvcVclHrdParams,__n);
        HRDParams::operator=(pvVar4,pvVar3);
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->mvcHrdParamsBitPos,__n);
      bitPos = *pvVar5;
      pvVar3 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                         (&this->mvcNalHrdParams,__n);
      insertHrdData(this,bitPos,iVar1,iVar2,false,pvVar3);
      pvVar3 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                         (&this->mvcNalHrdParams,__n);
      pvVar3->isPresent = true;
      pvVar3 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                         (&this->mvcVclHrdParams,__n);
      pvVar3->isPresent = true;
    }
  }
  if ((((this->nalHrdParams).isPresent & 1U) == 0) || (((this->vclHrdParams).isPresent & 1U) == 0))
  {
    iVar1 = (this->nalHrdParams).bitLen;
    iVar2 = (this->vclHrdParams).bitLen;
    if ((((this->nalHrdParams).isPresent & 1U) == 0) && (((this->vclHrdParams).isPresent & 1U) != 0)
       ) {
      if ((((this->nalHrdParams).isPresent & 1U) == 0) ||
         (((this->vclHrdParams).isPresent & 1U) != 0)) {
        HRDParams::operator=(&this->nalHrdParams,&this->vclHrdParams);
      }
      else {
        HRDParams::resetDefault(&this->nalHrdParams,false);
        HRDParams::resetDefault(&this->vclHrdParams,false);
      }
    }
    else {
      HRDParams::operator=(&this->vclHrdParams,&this->nalHrdParams);
    }
    if (this->hrdParamsBitPos == -1) {
      insertHrdData(this,this->vui_parameters_bit_pos,0,0,true,&this->nalHrdParams);
    }
    else {
      insertHrdData(this,this->hrdParamsBitPos,iVar1,iVar2,false,&this->nalHrdParams);
    }
    (this->nalHrdParams).isPresent = true;
    (this->vclHrdParams).isPresent = true;
  }
  (this->nalHrdParams).isPresent = true;
  (this->vclHrdParams).isPresent = true;
  if (this->fixed_frame_rate_flag == 0) {
    updateTimingInfo(this);
  }
  return;
}

Assistant:

void SPSUnit::insertHrdParameters()
{
    for (size_t i = mvcNalHrdParams.size(); i-- > 0;)
    {
        if (!mvcNalHrdParams[i].isPresent || !mvcVclHrdParams[i].isPresent)
        {
            const int nalBitLen = mvcNalHrdParams[i].bitLen;
            const int vclBitLen = mvcVclHrdParams[i].bitLen;

            if (mvcNalHrdParams[i].isPresent || !mvcVclHrdParams[i].isPresent)
                mvcVclHrdParams[i] = mvcNalHrdParams[i];
            else if (!mvcNalHrdParams[i].isPresent || mvcVclHrdParams[i].isPresent)
                mvcNalHrdParams[i] = mvcVclHrdParams[i];
            else
            {
                mvcNalHrdParams[i].resetDefault(true);
                mvcVclHrdParams[i].resetDefault(true);
            }

            insertHrdData(mvcHrdParamsBitPos[i], nalBitLen, vclBitLen, false, mvcNalHrdParams[i]);
            mvcNalHrdParams[i].isPresent = true;
            mvcVclHrdParams[i].isPresent = true;
        }
    }

    if (!nalHrdParams.isPresent || !vclHrdParams.isPresent)
    {
        const int nalBitLen = nalHrdParams.bitLen;
        const int vclBitLen = vclHrdParams.bitLen;

        if (nalHrdParams.isPresent || !vclHrdParams.isPresent)
            vclHrdParams = nalHrdParams;
        else if (!nalHrdParams.isPresent || vclHrdParams.isPresent)
            nalHrdParams = vclHrdParams;
        else
        {
            nalHrdParams.resetDefault(false);
            vclHrdParams.resetDefault(false);
        }

        if (hrdParamsBitPos != -1)
            insertHrdData(hrdParamsBitPos, nalBitLen, vclBitLen, false, nalHrdParams);
        else
            insertHrdData(vui_parameters_bit_pos, 0, 0, true, nalHrdParams);
        nalHrdParams.isPresent = true;
        vclHrdParams.isPresent = true;
    }
    nalHrdParams.isPresent = true;
    vclHrdParams.isPresent = true;

    if (!fixed_frame_rate_flag)
        updateTimingInfo();
}